

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

Maybe<capnp::JsonCodec::HandlerBase_*const_&> __thiscall
kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::
find<capnp::StructSchema::Field&>
          (HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*> *this,Field *key)

{
  Maybe<const_kj::HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*>::Entry_&>
  MVar1;
  
  MVar1 = Table<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Entry,kj::HashIndex<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Callbacks>>
          ::find<0ul,capnp::StructSchema::Field&>
                    ((Table<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Entry,kj::HashIndex<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Callbacks>>
                      *)this,key);
  if (MVar1.ptr != (Entry *)0x0) {
    MVar1.ptr = (Entry *)&(MVar1.ptr)->value;
  }
  return (Maybe<capnp::JsonCodec::HandlerBase_*const_&>)MVar1.ptr;
}

Assistant:

kj::Maybe<const Value&> HashMap<Key, Value>::find(KeyLike&& key) const {
  return table.find(key).map([](const Entry& e) -> const Value& { return e.value; });
}